

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRationalAttribute.cpp
# Opt level: O1

void __thiscall
Imf_3_4::TypedAttribute<Imf_3_4::Rational>::readValueFrom
          (TypedAttribute<Imf_3_4::Rational> *this,IStream *is,int size,int version)

{
  char b [4];
  uchar b_1 [4];
  int local_20;
  uint local_1c;
  
  (*is->_vptr_IStream[3])(is,&local_20,4);
  (this->_value).n = local_20;
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  (this->_value).d = local_1c;
  return;
}

Assistant:

IMF_EXPORT void
RationalAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    Xdr::read<StreamIO> (is, _value.n);
    Xdr::read<StreamIO> (is, _value.d);
}